

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap_str.c
# Opt level: O0

char * ap_str_trim_head_from_set(char *str,char *set)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcStack_40;
  uint found;
  char *p;
  size_t j;
  size_t i;
  size_t set_len;
  size_t str_len;
  char *set_local;
  char *str_local;
  
  if ((str != (char *)0x0) && (set != (char *)0x0)) {
    sVar2 = strlen(str);
    pcVar3 = (char *)strlen(set);
    if ((sVar2 != 0) && (pcVar3 != (char *)0x0)) {
      pcStack_40 = str;
      for (j = 0; j < sVar2; j = j + 1) {
        bVar1 = false;
        for (p = (char *)0x0; p < pcVar3; p = p + 1) {
          if (str[j] == set[(long)p]) {
            bVar1 = true;
            pcStack_40 = pcStack_40 + 1;
            break;
          }
        }
        if (!bVar1) break;
      }
      if (str < pcStack_40) {
        sVar2 = strlen(pcStack_40);
        memmove(str,pcStack_40,sVar2 + 1);
      }
    }
  }
  return str;
}

Assistant:

char * ap_str_trim_head_from_set (char *str, const char *set)
{
	size_t			str_len;
	size_t			set_len;
	size_t			i;
	size_t			j;
	char			*p				= NULL;
	unsigned int	found			= 0;

	if (str == NULL || set == NULL)
	{
		goto finish;
	}

	str_len = strlen (str);
	set_len = strlen (set);

	if (str_len == 0 || set_len == 0)
	{
		goto finish;
	}

	p = str;

	for (i = 0; i < str_len; i ++)
	{
		found = 0;

		for (j = 0; j < set_len; j ++)
		{
			if (str[i] == set[j])
			{
				found = 1;
				p ++;

				break;
			}
		}

		if (found == 0)
		{
			break;
		}
	}

	if (p > str)
	{
		str_len = strlen (p);
		memmove (str, p, str_len + 1);
	}

finish:
	return str;
}